

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.hxx
# Opt level: O2

void __thiscall nuraft::raft_server::commit_ret_elem::commit_ret_elem(commit_ret_elem *this)

{
  EventAwaiter::EventAwaiter(&this->awaiter_);
  timer_helper::timer_helper(&this->timer_,0,false);
  this->result_code_ = OK;
  (this->ret_value_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ret_value_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->async_result_).
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->async_result_).
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->callback_invoked_ = false;
  return;
}

Assistant:

commit_ret_elem()
        : ret_value_(nullptr)
        , result_code_(cmd_result_code::OK)
        , async_result_(nullptr)
        , callback_invoked_(false)
        {}